

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseProtocol.cpp
# Opt level: O0

uint16_t tonk::protocol::CalculateFuzzyNATPort(uint16_t externalPort,PCGRandom *portPrng)

{
  uint32_t uVar1;
  PCGRandom *in_RSI;
  ushort in_DI;
  int port;
  undefined4 local_14;
  
  uVar1 = siamese::PCGRandom::Next(in_RSI);
  local_14 = (uVar1 & 0xff) + (in_DI - 0x80);
  if (local_14 < 1) {
    local_14._0_2_ = (short)local_14 + 0x80;
  }
  else {
    if (0xffff < local_14) {
      local_14 = local_14 + -0x80;
    }
  }
  return (uint16_t)local_14;
}

Assistant:

uint16_t CalculateFuzzyNATPort(uint16_t externalPort, siamese::PCGRandom& portPrng)
{
    TONK_DEBUG_ASSERT(externalPort != 0);

    int port = externalPort;
    port -= kNATFuzzyPortRange;
    port += portPrng.Next() % (kNATFuzzyPortRange * 2);
    if (port <= 0) {
        port += kNATFuzzyPortRange;
    }
    else if (port >= 65536) {
        port -= kNATFuzzyPortRange;
    }
    return static_cast<uint16_t>(port);
}